

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-arithmetic.c
# Opt level: O2

EdwardsPoint * ecc_edwards_point_copy(EdwardsPoint *orig)

{
  EdwardsPoint *pEVar1;
  mp_int *pmVar2;
  
  pEVar1 = ecc_edwards_point_new_empty(orig->ec);
  pmVar2 = mp_copy(orig->X);
  pEVar1->X = pmVar2;
  pmVar2 = mp_copy(orig->Y);
  pEVar1->Y = pmVar2;
  pmVar2 = mp_copy(orig->Z);
  pEVar1->Z = pmVar2;
  pmVar2 = mp_copy(orig->T);
  pEVar1->T = pmVar2;
  return pEVar1;
}

Assistant:

EdwardsPoint *ecc_edwards_point_copy(EdwardsPoint *orig)
{
    EdwardsPoint *ep = ecc_edwards_point_new_empty(orig->ec);
    ep->X = mp_copy(orig->X);
    ep->Y = mp_copy(orig->Y);
    ep->Z = mp_copy(orig->Z);
    ep->T = mp_copy(orig->T);
    return ep;
}